

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_LowerRowLowerVarInfeasible_Test::TestBody
          (SimplexTest_LowerRowLowerVarInfeasible_Test *this)

{
  initializer_list<double> l;
  bool bVar1;
  char *message;
  LP *in_RDI;
  SimplexTest *in_stack_00000010;
  AssertionResult gtest_ar;
  double in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  AssertionResult *this_00;
  undefined4 in_stack_ffffffffffffff68;
  ColType in_stack_ffffffffffffff6c;
  pointer *lhs_expression;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar2;
  AssertHelper local_70;
  Message local_68;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  double in_stack_ffffffffffffffa8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  RowType in_stack_ffffffffffffffbc;
  LP *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  
  lhs_expression =
       &(in_RDI->A).cols.super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar2 = 2;
  LP::add_column(in_RDI,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58,9.39623432508154e-318);
  local_38 = 0x3ff0000000000000;
  local_30 = &local_38;
  local_28 = 1;
  l._M_len._0_4_ = in_stack_ffffffffffffff80;
  l._M_array = (iterator)lhs_expression;
  l._M_len._4_4_ = uVar2;
  DVector::DVector((DVector *)in_RDI,l);
  LP::add_row(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
              (double)in_stack_ffffffffffffffb0.ptr_,in_stack_ffffffffffffffa8,
              (DVector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  DVector::~DVector((DVector *)0x1d056c);
  SimplexTest::solve_lp(in_stack_00000010);
  this_00 = (AssertionResult *)&stack0xffffffffffffffa8;
  testing::internal::EqHelper<false>::Compare<fizplex::Simplex::Result,fizplex::Simplex::Result>
            ((char *)lhs_expression,(char *)in_RDI,
             (Result *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (Result *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1d0614);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x81,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message((Message *)0x1d0660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d06a0);
  return;
}

Assistant:

TEST_F(SimplexTest, LowerRowLowerVarInfeasible) {
  lp.add_column(ColType::LowerBound, 1.0, inf, 2);
  lp.add_row(RowType::LE, -inf, 0, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::Infeasible, result);
}